

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryBuilder::readDataSegments(WasmBinaryBuilder *this)

{
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> _Var1;
  bool bVar2;
  uint32_t uVar3;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  Expression *pEVar4;
  ulong in_RCX;
  string_view sVar5;
  string_view sVar6;
  IString IVar7;
  Name memory;
  Name name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ulong local_58;
  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
  *local_50;
  ulong local_48;
  key_type local_3c;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Stack_38;
  Index memIdx;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> curr;
  
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"== readDataSegments\n",0x14);
  }
  uVar3 = getU32LEB(this);
  if (uVar3 != 0) {
    local_58 = (ulong)uVar3;
    local_50 = &this->memoryRefs;
    local_48 = 0;
    do {
      bVar2 = SUB81(in_RCX,0);
      sVar5 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbe8acc),bVar2);
      memory.super_IString.str._M_len = sVar5._M_str;
      sVar6 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbe8acc),bVar2);
      memory.super_IString.str._M_str = (char *)sVar6._M_len;
      name.super_IString.str._M_str = (char *)sVar5._M_len;
      name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffc8;
      Builder::makeDataSegment
                (name,memory,sVar6._M_str._0_1_,(Expression *)0x0,(char *)0x0,(Address)0xbe8acc);
      uVar3 = getU32LEB(this);
      _Var1._M_t.
      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
      super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
           (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
           (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
           _Stack_38._M_head_impl;
      if (2 < uVar3) {
        std::__cxx11::to_string(&local_78,uVar3);
        std::operator+(&local_98,"bad segment flags, must be 0, 1, or 2, not ",&local_78);
        throwError(this,&local_98);
      }
      IVar7.str = (string_view)Name::fromInt(local_48);
      *(string_view *)
       _Var1._M_t.
       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
       super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = IVar7.str;
      *(bool *)((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x10) =
           false;
      (_Stack_38._M_head_impl)->isPassive = (bool)((byte)uVar3 & 1);
      if ((uVar3 & 1) == 0) {
        local_3c = 0;
        if (uVar3 == 2) {
          local_3c = getU32LEB(this);
        }
        this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
                  std::
                  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
                  ::operator[](local_50,&local_3c);
        local_78._M_dataplus._M_p = (pointer)&(_Stack_38._M_head_impl)->memory;
        std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
                  (this_00,(Name **)&local_78);
        pEVar4 = readExpression(this);
        *(Expression **)((long)_Stack_38._M_head_impl + 0x30) = pEVar4;
      }
      else {
        ((_Stack_38._M_head_impl)->memory).super_IString.str._M_len = 0;
        ((_Stack_38._M_head_impl)->memory).super_IString.str._M_str = (char *)0x0;
        (_Stack_38._M_head_impl)->offset = (Expression *)0x0;
      }
      uVar3 = getU32LEB(this);
      sVar5 = getByteView(this,(ulong)uVar3);
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)&local_78,sVar5._M_str,
                 sVar5._M_str + sVar5._M_len,(allocator_type *)&local_3c);
      std::vector<char,_std::allocator<char>_>::_M_move_assign
                (&(_Stack_38._M_head_impl)->data,&local_78);
      if ((Name *)local_78._M_dataplus._M_p != (Name *)0x0) {
        operator_delete(local_78._M_dataplus._M_p,
                        local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
      }
      Module::addDataSegment
                (this->wasm,
                 (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                 &stack0xffffffffffffffc8);
      if ((_Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
          _Stack_38._M_head_impl != (DataSegment *)0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)&stack0xffffffffffffffc8,
                   _Stack_38._M_head_impl);
      }
      in_RCX = local_48 + 1;
      local_48 = in_RCX;
    } while (local_58 != in_RCX);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readDataSegments() {
  BYN_TRACE("== readDataSegments\n");
  auto num = getU32LEB();
  for (size_t i = 0; i < num; i++) {
    auto curr = Builder::makeDataSegment();
    uint32_t flags = getU32LEB();
    if (flags > 2) {
      throwError("bad segment flags, must be 0, 1, or 2, not " +
                 std::to_string(flags));
    }
    curr->setName(Name::fromInt(i), false);
    curr->isPassive = flags & BinaryConsts::IsPassive;
    if (curr->isPassive) {
      curr->memory = Name();
      curr->offset = nullptr;
    } else {
      Index memIdx = 0;
      if (flags & BinaryConsts::HasIndex) {
        memIdx = getU32LEB();
      }
      memoryRefs[memIdx].push_back(&curr->memory);
      curr->offset = readExpression();
    }
    auto size = getU32LEB();
    auto data = getByteView(size);
    curr->data = {data.begin(), data.end()};
    wasm.addDataSegment(std::move(curr));
  }
}